

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

optional<pbrt::WrapMode> pbrt::ParseWrapMode(char *w)

{
  int iVar1;
  char *in_RSI;
  optional<pbrt::WrapMode> in_RDI;
  WrapMode *in_stack_ffffffffffffffc8;
  optional<pbrt::WrapMode> this;
  
  this = in_RDI;
  iVar1 = strcmp(in_RSI,"clamp");
  if (iVar1 == 0) {
    pstd::optional<pbrt::WrapMode>::optional
              ((optional<pbrt::WrapMode> *)this,in_stack_ffffffffffffffc8);
  }
  else {
    iVar1 = strcmp(in_RSI,"repeat");
    if (iVar1 == 0) {
      pstd::optional<pbrt::WrapMode>::optional
                ((optional<pbrt::WrapMode> *)this,in_stack_ffffffffffffffc8);
    }
    else {
      iVar1 = strcmp(in_RSI,"black");
      if (iVar1 == 0) {
        pstd::optional<pbrt::WrapMode>::optional
                  ((optional<pbrt::WrapMode> *)this,in_stack_ffffffffffffffc8);
      }
      else {
        iVar1 = strcmp(in_RSI,"octahedralsphere");
        if (iVar1 == 0) {
          pstd::optional<pbrt::WrapMode>::optional
                    ((optional<pbrt::WrapMode> *)this,in_stack_ffffffffffffffc8);
        }
        else {
          memset((void *)this,0,8);
          pstd::optional<pbrt::WrapMode>::optional((optional<pbrt::WrapMode> *)this);
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

inline pstd::optional<WrapMode> ParseWrapMode(const char *w) {
    if (!strcmp(w, "clamp"))
        return WrapMode::Clamp;
    else if (!strcmp(w, "repeat"))
        return WrapMode::Repeat;
    else if (!strcmp(w, "black"))
        return WrapMode::Black;
    else if (!strcmp(w, "octahedralsphere"))
        return WrapMode::OctahedralSphere;
    else
        return {};
}